

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameCollaborativeGraphical.h
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
BayesianGameCollaborativeGraphical::RestrictIndividualIndicesToScope<unsigned_int>
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          BayesianGameCollaborativeGraphical *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indivIndices,Index LRF)

{
  Scope agSc;
  allocator_type local_31;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_30;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_30,
             &(this->_m_agentScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
              super__Vector_impl_data._M_start[LRF].super_SDT);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,
             (long)local_30._M_impl.super__Vector_impl_data._M_finish -
             (long)local_30._M_impl.super__Vector_impl_data._M_start >> 2,&local_31);
  IndexTools::RestrictIndividualIndicesToScope<unsigned_int>
            (indivIndices,(Scope *)&local_30,__return_storage_ptr__);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_30);
  return __return_storage_ptr__;
}

Assistant:

typename std::vector<T> 
BayesianGameCollaborativeGraphical::RestrictIndividualIndicesToScope(const std::vector<T> &indivIndices, Index LRF) const
{
    Index e = LRF;
    Scope agSc = _m_agentScopes[e];
    std::vector<T> restr(agSc.size());
    IndexTools::RestrictIndividualIndicesToScope(indivIndices, agSc, restr);
    return(restr);
}